

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  short sVar11;
  int iVar12;
  GetterYs<short> *pGVar13;
  TransformerLogLog *pTVar14;
  ImPlotPlot *pIVar15;
  GetterYRef *pGVar16;
  ImDrawVert *pIVar17;
  ImDrawIdx *pIVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ImVec2 IVar22;
  ushort uVar23;
  ImPlotContext *pIVar24;
  ImPlotContext *pIVar25;
  bool bVar26;
  ImDrawIdx IVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  ImVec2 IVar31;
  float fVar32;
  ImVec2 IVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  
  pIVar24 = GImPlot;
  pGVar13 = this->Getter1;
  pTVar14 = this->Transformer;
  dVar21 = (double)(prim + 1);
  iVar12 = pGVar13->Count;
  sVar11 = *(short *)((long)pGVar13->Ys +
                     (long)(((prim + 1 + pGVar13->Offset) % iVar12 + iVar12) % iVar12) *
                     (long)pGVar13->Stride);
  dVar19 = log10((pGVar13->XScale * dVar21 + pGVar13->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  dVar7 = pIVar24->LogDenX;
  pIVar15 = pIVar24->CurrentPlot;
  dVar8 = (pIVar15->XAxis).Range.Min;
  dVar9 = (pIVar15->XAxis).Range.Max;
  dVar20 = log10((double)(int)sVar11 / pIVar15->YAxis[pTVar14->YAxis].Range.Min);
  pIVar25 = GImPlot;
  iVar12 = pTVar14->YAxis;
  pIVar15 = pIVar24->CurrentPlot;
  dVar10 = pIVar15->YAxis[iVar12].Range.Min;
  fVar30 = (float)((((double)(float)(dVar19 / dVar7) * (dVar9 - dVar8) + dVar8) -
                   (pIVar15->XAxis).Range.Min) * pIVar24->Mx +
                  (double)pIVar24->PixelRange[iVar12].Min.x);
  fVar29 = (float)((((double)(float)(dVar20 / pIVar24->LogDenY[iVar12]) *
                     (pIVar15->YAxis[iVar12].Range.Max - dVar10) + dVar10) - dVar10) *
                   pIVar24->My[iVar12] + (double)pIVar24->PixelRange[iVar12].Min.y);
  pGVar16 = this->Getter2;
  pTVar14 = this->Transformer;
  dVar7 = pGVar16->YRef;
  dVar19 = log10((dVar21 * pGVar16->XScale + pGVar16->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  dVar8 = pIVar25->LogDenX;
  pIVar15 = pIVar25->CurrentPlot;
  dVar9 = (pIVar15->XAxis).Range.Min;
  dVar10 = (pIVar15->XAxis).Range.Max;
  dVar20 = log10(dVar7 / pIVar15->YAxis[pTVar14->YAxis].Range.Min);
  iVar12 = pTVar14->YAxis;
  pIVar15 = pIVar25->CurrentPlot;
  dVar7 = pIVar15->YAxis[iVar12].Range.Min;
  fVar34 = (float)((((double)(float)(dVar19 / dVar8) * (dVar10 - dVar9) + dVar9) -
                   (pIVar15->XAxis).Range.Min) * pIVar25->Mx +
                  (double)pIVar25->PixelRange[iVar12].Min.x);
  fVar36 = (float)((((double)(float)(dVar20 / pIVar25->LogDenY[iVar12]) *
                     (pIVar15->YAxis[iVar12].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar25->My[iVar12] + (double)pIVar25->PixelRange[iVar12].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar32 = fVar3;
  if (fVar5 <= fVar3) {
    fVar32 = fVar5;
  }
  if (fVar29 <= fVar32) {
    fVar32 = fVar29;
  }
  if (fVar36 <= fVar32) {
    fVar32 = fVar36;
  }
  bVar26 = false;
  if ((fVar32 < (cull_rect->Max).y) &&
     (fVar32 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar28 = -(uint)(fVar29 <= fVar32),
     fVar32 = (float)(~uVar28 & (uint)fVar29 | uVar28 & (uint)fVar32),
     uVar28 = -(uint)(fVar36 <= fVar32),
     fVar32 = (float)(~uVar28 & (uint)fVar36 | uVar28 & (uint)fVar32), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar32 && fVar32 != *pfVar1)) {
    fVar32 = fVar2;
    if (fVar4 <= fVar2) {
      fVar32 = fVar4;
    }
    if (fVar30 <= fVar32) {
      fVar32 = fVar30;
    }
    if (fVar34 <= fVar32) {
      fVar32 = fVar34;
    }
    bVar26 = false;
    if (fVar32 < (cull_rect->Max).x) {
      fVar32 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar28 = -(uint)(fVar30 <= fVar32);
      fVar32 = (float)(~uVar28 & (uint)fVar30 | uVar28 & (uint)fVar32);
      uVar28 = -(uint)(fVar34 <= fVar32);
      fVar32 = (float)(~uVar28 & (uint)fVar34 | uVar28 & (uint)fVar32);
      bVar26 = (cull_rect->Min).x <= fVar32 && fVar32 != (cull_rect->Min).x;
    }
  }
  IVar31.y = fVar29;
  IVar31.x = fVar30;
  IVar33.y = fVar36;
  IVar33.x = fVar34;
  if (bVar26 != false) {
    fVar32 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar38 = fVar2 * fVar29 - fVar30 * fVar3;
    fVar37 = fVar4 * fVar36 - fVar34 * fVar5;
    fVar35 = (fVar2 - fVar30) * (fVar5 - fVar36) - (fVar4 - fVar34) * (fVar3 - fVar29);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar17 = DrawList->_VtxWritePtr;
    pIVar17->col = this->Col;
    pIVar17[1].pos = IVar31;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar17 = DrawList->_VtxWritePtr;
    pIVar17[1].col = this->Col;
    IVar22.y = ((fVar5 - fVar36) * fVar38 - (fVar3 - fVar29) * fVar37) / fVar35;
    IVar22.x = (fVar38 * (fVar4 - fVar34) - (fVar2 - fVar30) * fVar37) / fVar35;
    pIVar17[2].pos = IVar22;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar17 = DrawList->_VtxWritePtr;
    pIVar17[2].col = this->Col;
    pIVar17[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar17 = DrawList->_VtxWritePtr;
    pIVar17[3].col = this->Col;
    pIVar17[4].pos = IVar33;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar17 = DrawList->_VtxWritePtr;
    pIVar17[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar17 + 5;
    uVar28 = DrawList->_VtxCurrentIdx;
    pIVar18 = DrawList->_IdxWritePtr;
    IVar27 = (ImDrawIdx)uVar28;
    *pIVar18 = IVar27;
    uVar23 = -(ushort)(fVar6 < fVar32 && fVar29 < fVar36 || fVar32 < fVar6 && fVar36 < fVar29) & 1;
    pIVar18[1] = IVar27 + uVar23 + 1;
    pIVar18[2] = IVar27 + 3;
    pIVar18[3] = IVar27 + 1;
    pIVar18[4] = (uVar23 ^ 3) + IVar27;
    pIVar18[5] = IVar27 + 4;
    DrawList->_IdxWritePtr = pIVar18 + 6;
    DrawList->_VtxCurrentIdx = uVar28 + 5;
  }
  this->P11 = IVar31;
  this->P12 = IVar33;
  return bVar26;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }